

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O1

void __thiscall
bsim::dynamic_bit_vector::dynamic_bit_vector(dynamic_bit_vector *this,dynamic_bit_vector *other)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->bits,
             (long)(other->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(other->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  uVar1 = other->N;
  uVar3 = uVar1 + 7;
  if (-1 < (int)uVar1) {
    uVar3 = uVar1;
  }
  this->N = uVar1;
  if (0 < (int)((((int)uVar3 >> 3) - (uint)((uVar1 & 7) == 0)) + 1)) {
    lVar2 = 0;
    do {
      (this->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] =
           (other->bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar2];
      lVar2 = lVar2 + 1;
      uVar1 = this->N;
      uVar3 = uVar1 + 7;
      if (-1 < (int)uVar1) {
        uVar3 = uVar1;
      }
    } while (lVar2 < (int)((((int)uVar3 >> 3) - (uint)((uVar1 & 7) == 0)) + 1));
  }
  return;
}

Assistant:

dynamic_bit_vector(const dynamic_bit_vector& other) {
      bits.resize(other.bits.size());
      N = other.bitLength();
      for (int i = 0; i < NUM_BYTES(N); i++) {
	bits[i] = other.bits[i];
      }
    }